

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O3

void tinyobj::InitMaterial(material_t *material)

{
  (material->ambient_texopt).bump_multiplier = 1.0;
  (material->ambient_texopt).sharpness = 1.0;
  (material->ambient_texopt).brightness = 0.0;
  (material->ambient_texopt).contrast = 1.0;
  (material->ambient_texopt).origin_offset[0] = 0.0;
  (material->ambient_texopt).origin_offset[1] = 0.0;
  (material->ambient_texopt).origin_offset[2] = 0.0;
  (material->ambient_texopt).scale[0] = 1.0;
  (material->ambient_texopt).scale[1] = 1.0;
  *(undefined8 *)((material->ambient_texopt).scale + 2) = 0x3f800000;
  (material->ambient_texopt).turbulence[1] = 0.0;
  (material->ambient_texopt).turbulence[2] = 0.0;
  (material->ambient_texopt).texture_resolution = -1;
  (material->ambient_texopt).clamp = false;
  (material->ambient_texopt).imfchan = 'm';
  (material->ambient_texopt).blendu = true;
  (material->ambient_texopt).blendv = true;
  (material->ambient_texopt).type = TEXTURE_TYPE_NONE;
  (material->diffuse_texopt).bump_multiplier = 1.0;
  (material->diffuse_texopt).sharpness = 1.0;
  (material->diffuse_texopt).brightness = 0.0;
  (material->diffuse_texopt).contrast = 1.0;
  (material->diffuse_texopt).origin_offset[0] = 0.0;
  (material->diffuse_texopt).origin_offset[1] = 0.0;
  (material->diffuse_texopt).origin_offset[2] = 0.0;
  (material->diffuse_texopt).scale[0] = 1.0;
  (material->diffuse_texopt).scale[1] = 1.0;
  *(undefined8 *)((material->diffuse_texopt).scale + 2) = 0x3f800000;
  (material->diffuse_texopt).turbulence[1] = 0.0;
  (material->diffuse_texopt).turbulence[2] = 0.0;
  (material->diffuse_texopt).texture_resolution = -1;
  (material->diffuse_texopt).clamp = false;
  (material->diffuse_texopt).imfchan = 'm';
  (material->diffuse_texopt).blendu = true;
  (material->diffuse_texopt).blendv = true;
  (material->diffuse_texopt).type = TEXTURE_TYPE_NONE;
  (material->specular_texopt).bump_multiplier = 1.0;
  (material->specular_texopt).sharpness = 1.0;
  (material->specular_texopt).brightness = 0.0;
  (material->specular_texopt).contrast = 1.0;
  (material->specular_texopt).origin_offset[0] = 0.0;
  (material->specular_texopt).origin_offset[1] = 0.0;
  (material->specular_texopt).origin_offset[2] = 0.0;
  (material->specular_texopt).scale[0] = 1.0;
  (material->specular_texopt).scale[1] = 1.0;
  *(undefined8 *)((material->specular_texopt).scale + 2) = 0x3f800000;
  (material->specular_texopt).turbulence[1] = 0.0;
  (material->specular_texopt).turbulence[2] = 0.0;
  (material->specular_texopt).texture_resolution = -1;
  (material->specular_texopt).clamp = false;
  (material->specular_texopt).imfchan = 'm';
  (material->specular_texopt).blendu = true;
  (material->specular_texopt).blendv = true;
  (material->specular_texopt).type = TEXTURE_TYPE_NONE;
  (material->specular_highlight_texopt).clamp = false;
  (material->specular_highlight_texopt).imfchan = 'm';
  (material->specular_highlight_texopt).blendu = true;
  (material->specular_highlight_texopt).blendv = true;
  (material->specular_highlight_texopt).bump_multiplier = 1.0;
  (material->specular_highlight_texopt).sharpness = 1.0;
  (material->specular_highlight_texopt).brightness = 0.0;
  (material->specular_highlight_texopt).contrast = 1.0;
  (material->specular_highlight_texopt).origin_offset[0] = 0.0;
  (material->specular_highlight_texopt).origin_offset[1] = 0.0;
  (material->specular_highlight_texopt).origin_offset[2] = 0.0;
  (material->specular_highlight_texopt).scale[0] = 1.0;
  (material->specular_highlight_texopt).scale[1] = 1.0;
  *(undefined8 *)((material->specular_highlight_texopt).scale + 2) = 0x3f800000;
  (material->specular_highlight_texopt).turbulence[1] = 0.0;
  (material->specular_highlight_texopt).turbulence[2] = 0.0;
  (material->specular_highlight_texopt).texture_resolution = -1;
  (material->specular_highlight_texopt).type = TEXTURE_TYPE_NONE;
  (material->bump_texopt).clamp = false;
  (material->bump_texopt).imfchan = 'l';
  (material->bump_texopt).blendu = true;
  (material->bump_texopt).blendv = true;
  (material->bump_texopt).bump_multiplier = 1.0;
  (material->bump_texopt).sharpness = 1.0;
  (material->bump_texopt).brightness = 0.0;
  (material->bump_texopt).contrast = 1.0;
  (material->bump_texopt).origin_offset[0] = 0.0;
  (material->bump_texopt).origin_offset[1] = 0.0;
  (material->bump_texopt).origin_offset[2] = 0.0;
  (material->bump_texopt).scale[0] = 1.0;
  (material->bump_texopt).scale[1] = 1.0;
  *(undefined8 *)((material->bump_texopt).scale + 2) = 0x3f800000;
  (material->bump_texopt).turbulence[1] = 0.0;
  (material->bump_texopt).turbulence[2] = 0.0;
  (material->bump_texopt).texture_resolution = -1;
  (material->bump_texopt).type = TEXTURE_TYPE_NONE;
  (material->displacement_texopt).clamp = false;
  (material->displacement_texopt).imfchan = 'm';
  (material->displacement_texopt).blendu = true;
  (material->displacement_texopt).blendv = true;
  (material->displacement_texopt).bump_multiplier = 1.0;
  (material->displacement_texopt).sharpness = 1.0;
  (material->displacement_texopt).brightness = 0.0;
  (material->displacement_texopt).contrast = 1.0;
  (material->displacement_texopt).origin_offset[0] = 0.0;
  (material->displacement_texopt).origin_offset[1] = 0.0;
  (material->displacement_texopt).origin_offset[2] = 0.0;
  (material->displacement_texopt).scale[0] = 1.0;
  (material->displacement_texopt).scale[1] = 1.0;
  *(undefined8 *)((material->displacement_texopt).scale + 2) = 0x3f800000;
  (material->displacement_texopt).turbulence[1] = 0.0;
  (material->displacement_texopt).turbulence[2] = 0.0;
  (material->displacement_texopt).texture_resolution = -1;
  (material->displacement_texopt).type = TEXTURE_TYPE_NONE;
  (material->alpha_texopt).bump_multiplier = 1.0;
  (material->alpha_texopt).sharpness = 1.0;
  (material->alpha_texopt).brightness = 0.0;
  (material->alpha_texopt).contrast = 1.0;
  (material->alpha_texopt).origin_offset[0] = 0.0;
  (material->alpha_texopt).origin_offset[1] = 0.0;
  (material->alpha_texopt).origin_offset[2] = 0.0;
  (material->alpha_texopt).scale[0] = 1.0;
  (material->alpha_texopt).scale[1] = 1.0;
  *(undefined8 *)((material->alpha_texopt).scale + 2) = 0x3f800000;
  (material->alpha_texopt).turbulence[1] = 0.0;
  (material->alpha_texopt).turbulence[2] = 0.0;
  (material->alpha_texopt).texture_resolution = -1;
  (material->alpha_texopt).clamp = false;
  (material->alpha_texopt).imfchan = 'm';
  (material->alpha_texopt).blendu = true;
  (material->alpha_texopt).blendv = true;
  (material->alpha_texopt).type = TEXTURE_TYPE_NONE;
  (material->reflection_texopt).bump_multiplier = 1.0;
  (material->reflection_texopt).sharpness = 1.0;
  (material->reflection_texopt).brightness = 0.0;
  (material->reflection_texopt).contrast = 1.0;
  (material->reflection_texopt).origin_offset[0] = 0.0;
  (material->reflection_texopt).origin_offset[1] = 0.0;
  (material->reflection_texopt).origin_offset[2] = 0.0;
  (material->reflection_texopt).scale[0] = 1.0;
  (material->reflection_texopt).scale[1] = 1.0;
  *(undefined8 *)((material->reflection_texopt).scale + 2) = 0x3f800000;
  (material->reflection_texopt).turbulence[1] = 0.0;
  (material->reflection_texopt).turbulence[2] = 0.0;
  (material->reflection_texopt).texture_resolution = -1;
  (material->reflection_texopt).clamp = false;
  (material->reflection_texopt).imfchan = 'm';
  (material->reflection_texopt).blendu = true;
  (material->reflection_texopt).blendv = true;
  (material->reflection_texopt).type = TEXTURE_TYPE_NONE;
  (material->roughness_texopt).clamp = false;
  (material->roughness_texopt).imfchan = 'm';
  (material->roughness_texopt).blendu = true;
  (material->roughness_texopt).blendv = true;
  (material->roughness_texopt).bump_multiplier = 1.0;
  (material->roughness_texopt).sharpness = 1.0;
  (material->roughness_texopt).brightness = 0.0;
  (material->roughness_texopt).contrast = 1.0;
  (material->roughness_texopt).origin_offset[0] = 0.0;
  (material->roughness_texopt).origin_offset[1] = 0.0;
  (material->roughness_texopt).origin_offset[2] = 0.0;
  (material->roughness_texopt).scale[0] = 1.0;
  (material->roughness_texopt).scale[1] = 1.0;
  *(undefined8 *)((material->roughness_texopt).scale + 2) = 0x3f800000;
  (material->roughness_texopt).turbulence[1] = 0.0;
  (material->roughness_texopt).turbulence[2] = 0.0;
  (material->roughness_texopt).texture_resolution = -1;
  (material->roughness_texopt).type = TEXTURE_TYPE_NONE;
  (material->metallic_texopt).bump_multiplier = 1.0;
  (material->metallic_texopt).clamp = false;
  (material->metallic_texopt).imfchan = 'm';
  (material->metallic_texopt).blendu = true;
  (material->metallic_texopt).blendv = true;
  (material->metallic_texopt).sharpness = 1.0;
  (material->metallic_texopt).brightness = 0.0;
  (material->metallic_texopt).contrast = 1.0;
  (material->metallic_texopt).origin_offset[0] = 0.0;
  (material->metallic_texopt).origin_offset[1] = 0.0;
  (material->metallic_texopt).origin_offset[2] = 0.0;
  (material->metallic_texopt).scale[0] = 1.0;
  (material->metallic_texopt).scale[1] = 1.0;
  *(undefined8 *)((material->metallic_texopt).scale + 2) = 0x3f800000;
  (material->metallic_texopt).turbulence[1] = 0.0;
  (material->metallic_texopt).turbulence[2] = 0.0;
  (material->metallic_texopt).texture_resolution = -1;
  (material->metallic_texopt).type = TEXTURE_TYPE_NONE;
  (material->sheen_texopt).bump_multiplier = 1.0;
  (material->sheen_texopt).clamp = false;
  (material->sheen_texopt).imfchan = 'm';
  (material->sheen_texopt).blendu = true;
  (material->sheen_texopt).blendv = true;
  (material->sheen_texopt).sharpness = 1.0;
  (material->sheen_texopt).brightness = 0.0;
  (material->sheen_texopt).contrast = 1.0;
  (material->sheen_texopt).origin_offset[0] = 0.0;
  (material->sheen_texopt).origin_offset[1] = 0.0;
  (material->sheen_texopt).origin_offset[2] = 0.0;
  (material->sheen_texopt).scale[0] = 1.0;
  (material->sheen_texopt).scale[1] = 1.0;
  *(undefined8 *)((material->sheen_texopt).scale + 2) = 0x3f800000;
  (material->sheen_texopt).turbulence[1] = 0.0;
  (material->sheen_texopt).turbulence[2] = 0.0;
  (material->sheen_texopt).texture_resolution = -1;
  (material->sheen_texopt).type = TEXTURE_TYPE_NONE;
  (material->emissive_texopt).bump_multiplier = 1.0;
  (material->emissive_texopt).clamp = false;
  (material->emissive_texopt).imfchan = 'm';
  (material->emissive_texopt).blendu = true;
  (material->emissive_texopt).blendv = true;
  (material->emissive_texopt).sharpness = 1.0;
  (material->emissive_texopt).brightness = 0.0;
  (material->emissive_texopt).contrast = 1.0;
  (material->emissive_texopt).origin_offset[0] = 0.0;
  (material->emissive_texopt).origin_offset[1] = 0.0;
  (material->emissive_texopt).origin_offset[2] = 0.0;
  (material->emissive_texopt).scale[0] = 1.0;
  (material->emissive_texopt).scale[1] = 1.0;
  *(undefined8 *)((material->emissive_texopt).scale + 2) = 0x3f800000;
  (material->emissive_texopt).turbulence[1] = 0.0;
  (material->emissive_texopt).turbulence[2] = 0.0;
  (material->emissive_texopt).texture_resolution = -1;
  (material->emissive_texopt).type = TEXTURE_TYPE_NONE;
  (material->normal_texopt).bump_multiplier = 1.0;
  (material->normal_texopt).clamp = false;
  (material->normal_texopt).imfchan = 'm';
  (material->normal_texopt).blendu = true;
  (material->normal_texopt).blendv = true;
  (material->normal_texopt).sharpness = 1.0;
  (material->normal_texopt).brightness = 0.0;
  (material->normal_texopt).contrast = 1.0;
  (material->normal_texopt).origin_offset[0] = 0.0;
  (material->normal_texopt).origin_offset[1] = 0.0;
  (material->normal_texopt).origin_offset[2] = 0.0;
  (material->normal_texopt).scale[0] = 1.0;
  (material->normal_texopt).scale[1] = 1.0;
  *(undefined8 *)((material->normal_texopt).scale + 2) = 0x3f800000;
  (material->normal_texopt).turbulence[1] = 0.0;
  (material->normal_texopt).turbulence[2] = 0.0;
  (material->normal_texopt).texture_resolution = -1;
  (material->normal_texopt).type = TEXTURE_TYPE_NONE;
  std::__cxx11::string::_M_replace
            ((ulong)material,0,(char *)(material->name)._M_string_length,0x2c1232);
  std::__cxx11::string::_M_replace
            ((ulong)&material->ambient_texname,0,
             (char *)(material->ambient_texname)._M_string_length,0x2c1232);
  std::__cxx11::string::_M_replace
            ((ulong)&material->diffuse_texname,0,
             (char *)(material->diffuse_texname)._M_string_length,0x2c1232);
  std::__cxx11::string::_M_replace
            ((ulong)&material->specular_texname,0,
             (char *)(material->specular_texname)._M_string_length,0x2c1232);
  std::__cxx11::string::_M_replace
            ((ulong)&material->specular_highlight_texname,0,
             (char *)(material->specular_highlight_texname)._M_string_length,0x2c1232);
  std::__cxx11::string::_M_replace
            ((ulong)&material->bump_texname,0,(char *)(material->bump_texname)._M_string_length,
             0x2c1232);
  std::__cxx11::string::_M_replace
            ((ulong)&material->displacement_texname,0,
             (char *)(material->displacement_texname)._M_string_length,0x2c1232);
  std::__cxx11::string::_M_replace
            ((ulong)&material->reflection_texname,0,
             (char *)(material->reflection_texname)._M_string_length,0x2c1232);
  std::__cxx11::string::_M_replace
            ((ulong)&material->alpha_texname,0,(char *)(material->alpha_texname)._M_string_length,
             0x2c1232);
  material->ambient[0] = 0.0;
  material->ambient[1] = 0.0;
  *(undefined8 *)(material->ambient + 2) = 0;
  material->diffuse[1] = 0.0;
  material->diffuse[2] = 0.0;
  material->specular[0] = 0.0;
  material->specular[1] = 0.0;
  *(undefined8 *)(material->specular + 2) = 0;
  material->transmittance[1] = 0.0;
  material->transmittance[2] = 0.0;
  *(undefined8 *)(material->transmittance + 2) = 0;
  material->emission[1] = 0.0;
  material->emission[2] = 0.0;
  material->dissolve = 1.0;
  material->illum = 0;
  material->shininess = 1.0;
  material->ior = 1.0;
  material->roughness = 0.0;
  material->metallic = 0.0;
  material->sheen = 0.0;
  material->clearcoat_thickness = 0.0;
  material->clearcoat_thickness = 0.0;
  material->clearcoat_roughness = 0.0;
  material->anisotropy = 0.0;
  material->anisotropy_rotation = 0.0;
  std::__cxx11::string::_M_replace
            ((ulong)&material->roughness_texname,0,
             (char *)(material->roughness_texname)._M_string_length,0x2c1232);
  std::__cxx11::string::_M_replace
            ((ulong)&material->metallic_texname,0,
             (char *)(material->metallic_texname)._M_string_length,0x2c1232);
  std::__cxx11::string::_M_replace
            ((ulong)&material->sheen_texname,0,(char *)(material->sheen_texname)._M_string_length,
             0x2c1232);
  std::__cxx11::string::_M_replace
            ((ulong)&material->emissive_texname,0,
             (char *)(material->emissive_texname)._M_string_length,0x2c1232);
  std::__cxx11::string::_M_replace
            ((ulong)&material->normal_texname,0,(char *)(material->normal_texname)._M_string_length,
             0x2c1232);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&(material->unknown_parameter)._M_t);
  return;
}

Assistant:

static void InitMaterial(material_t *material) {
  InitTexOpt(&material->ambient_texopt, /* is_bump */ false);
  InitTexOpt(&material->diffuse_texopt, /* is_bump */ false);
  InitTexOpt(&material->specular_texopt, /* is_bump */ false);
  InitTexOpt(&material->specular_highlight_texopt, /* is_bump */ false);
  InitTexOpt(&material->bump_texopt, /* is_bump */ true);
  InitTexOpt(&material->displacement_texopt, /* is_bump */ false);
  InitTexOpt(&material->alpha_texopt, /* is_bump */ false);
  InitTexOpt(&material->reflection_texopt, /* is_bump */ false);
  InitTexOpt(&material->roughness_texopt, /* is_bump */ false);
  InitTexOpt(&material->metallic_texopt, /* is_bump */ false);
  InitTexOpt(&material->sheen_texopt, /* is_bump */ false);
  InitTexOpt(&material->emissive_texopt, /* is_bump */ false);
  InitTexOpt(&material->normal_texopt,
             /* is_bump */ false);  // @fixme { is_bump will be true? }
  material->name = "";
  material->ambient_texname = "";
  material->diffuse_texname = "";
  material->specular_texname = "";
  material->specular_highlight_texname = "";
  material->bump_texname = "";
  material->displacement_texname = "";
  material->reflection_texname = "";
  material->alpha_texname = "";
  for (int i = 0; i < 3; i++) {
    material->ambient[i] = static_cast<real_t>(0.0);
    material->diffuse[i] = static_cast<real_t>(0.0);
    material->specular[i] = static_cast<real_t>(0.0);
    material->transmittance[i] = static_cast<real_t>(0.0);
    material->emission[i] = static_cast<real_t>(0.0);
  }
  material->illum = 0;
  material->dissolve = static_cast<real_t>(1.0);
  material->shininess = static_cast<real_t>(1.0);
  material->ior = static_cast<real_t>(1.0);

  material->roughness = static_cast<real_t>(0.0);
  material->metallic = static_cast<real_t>(0.0);
  material->sheen = static_cast<real_t>(0.0);
  material->clearcoat_thickness = static_cast<real_t>(0.0);
  material->clearcoat_roughness = static_cast<real_t>(0.0);
  material->anisotropy_rotation = static_cast<real_t>(0.0);
  material->anisotropy = static_cast<real_t>(0.0);
  material->roughness_texname = "";
  material->metallic_texname = "";
  material->sheen_texname = "";
  material->emissive_texname = "";
  material->normal_texname = "";

  material->unknown_parameter.clear();
}